

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * __thiscall
fmt::v6::
format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
::on_format_specs(format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                  *this,wchar_t *begin,wchar_t *end)

{
  bool bVar1;
  iterator it;
  wchar_t *in_RDX;
  basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler> *in_RDI;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
  handler;
  basic_format_specs<wchar_t> specs;
  custom_formatter<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  f;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>
  *in_stack_ffffffffffffff28;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>
  *this_00;
  basic_format_specs<wchar_t> *in_stack_ffffffffffffff38;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
  *in_stack_ffffffffffffff40;
  format_specs *in_stack_ffffffffffffff48;
  basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler> *in_stack_ffffffffffffff50;
  context_type *in_stack_ffffffffffffff58;
  arg_formatter<fmt::v6::buffer_range<wchar_t>_> *in_stack_ffffffffffffff60;
  basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *in_stack_ffffffffffffffa0;
  arg_formatter<fmt::v6::buffer_range<wchar_t>_> *in_stack_ffffffffffffffa8;
  custom_formatter<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  local_30;
  wchar_t *local_20;
  wchar_t *local_18;
  iterator local_8;
  
  local_20 = in_RDX;
  advance_to<wchar_t,fmt::v6::internal::error_handler>
            ((basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler> *)
             in_stack_ffffffffffffff40,&in_stack_ffffffffffffff38->width);
  internal::
  custom_formatter<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  ::custom_formatter(&local_30,
                     (basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler> *)
                     &(in_RDI->format_str_).size_,
                     (basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>
                      *)&in_RDI[1].format_str_.size_);
  bVar1 = visit_format_arg<fmt::v6::internal::custom_formatter<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>
                    ((custom_formatter<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                      *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (bVar1) {
    local_8 = basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>::begin(in_RDI);
  }
  else {
    basic_format_specs<wchar_t>::basic_format_specs((basic_format_specs<wchar_t> *)0x224d0e);
    internal::
    specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
    ::specs_handler(&in_stack_ffffffffffffff40->
                     super_specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                    ,in_stack_ffffffffffffff38,in_RDI,in_stack_ffffffffffffff28);
    basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
    ::type((basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
            *)&in_RDI[3].format_str_.size_);
    internal::
    specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
    ::specs_checker(in_stack_ffffffffffffff40,
                    (specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                     *)in_stack_ffffffffffffff38,(type)((ulong)in_RDI >> 0x20));
    local_18 = internal::
               parse_format_specs<wchar_t,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&>
                         (&in_stack_ffffffffffffff38->width,(wchar_t *)in_RDI,
                          (specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
                           *)in_stack_ffffffffffffff28);
    if ((local_18 == local_20) || (*local_18 != L'}')) {
      internal::error_handler::on_error
                ((error_handler *)in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    }
    advance_to<wchar_t,fmt::v6::internal::error_handler>
              ((basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler> *)
               in_stack_ffffffffffffff40,&in_stack_ffffffffffffff38->width);
    this_00 = (basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>
               *)&in_RDI[1].format_str_.size_;
    arg_formatter<fmt::v6::buffer_range<wchar_t>_>::arg_formatter
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48);
    it = visit_format_arg<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>
                   (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>::
    advance_to(this_00,(iterator)it.container);
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

const Char* on_format_specs(const Char* begin, const Char* end) {
    advance_to(parse_context, begin);
    internal::custom_formatter<Context> f(parse_context, context);
    if (visit_format_arg(f, arg)) return parse_context.begin();
    basic_format_specs<Char> specs;
    using internal::specs_handler;
    using parse_context_t = basic_format_parse_context<Char>;
    internal::specs_checker<specs_handler<parse_context_t, Context>> handler(
        specs_handler<parse_context_t, Context>(specs, parse_context, context),
        arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}') on_error("missing '}' in format string");
    advance_to(parse_context, begin);
    context.advance_to(
        visit_format_arg(ArgFormatter(context, &parse_context, &specs), arg));
    return begin;
  }